

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSSLWraper.cpp
# Opt level: O0

int __thiscall OpenSSLWrapper::SslConnection::SSLGetError(SslConnection *this,int iResult)

{
  int iVar1;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lk;
  int iResult_local;
  SslConnection *this_local;
  
  lk._M_device._4_4_ = iResult;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->m_mxSsl);
  iVar1 = SSL_get_error((SSL *)this->m_ssl,lk._M_device._4_4_);
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return iVar1;
}

Assistant:

int SslConnection::SSLGetError(int iResult)
    {
        lock_guard<mutex> lk(m_mxSsl);
        return SSL_get_error(m_ssl, iResult);
    }